

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O0

bool __thiscall dap::ContentReader::scan(ContentReader *this,uint8_t *seq,size_t len)

{
  bool bVar1;
  size_t len_local;
  uint8_t *seq_local;
  ContentReader *this_local;
  
  while( true ) {
    bVar1 = buffer(this,len);
    if (!bVar1) {
      return false;
    }
    bVar1 = match(this,seq,len);
    if (bVar1) break;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->buf);
  }
  return true;
}

Assistant:

bool ContentReader::scan(const uint8_t* seq, size_t len) {
  while (buffer(len)) {
    if (match(seq, len)) {
      return true;
    }
    buf.pop_front();
  }
  return false;
}